

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

void __thiscall avro::EnumParser::parse(EnumParser *this,Reader *reader,uint8_t *address)

{
  long lVar1;
  size_type __n;
  const_reference pvVar2;
  NoOp *noOp;
  long in_RDX;
  ReaderImpl<avro::NullValidator> *in_RDI;
  EnumRepresentation *location;
  size_t val;
  
  __n = ReaderImpl<avro::NullValidator>::readEnum(in_RDI);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x18),__n);
  if (*pvVar2 < *(ulong *)(in_RDI + 0x10)) {
    lVar1 = *(long *)(in_RDI + 8);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x18),__n
                       );
    *(EnumRepresentation *)(in_RDX + lVar1) = (EnumRepresentation)*pvVar2;
    noOp = avro::operator<<((NoOp *)&noop,(char (*) [13])"Setting enum");
    avro::operator<<(noOp,(EnumRepresentation *)(in_RDX + lVar1));
  }
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        size_t val = static_cast<size_t>(reader.readEnum());
        assert(static_cast<size_t>(val) < mapping_.size());

        if(mapping_[val] < readerSize_) {
            EnumRepresentation* location = reinterpret_cast<EnumRepresentation *> (address + offset_);
            *location = static_cast<EnumRepresentation>(mapping_[val]);
            DEBUG_OUT("Setting enum" << *location);
        }
    }